

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O3

void FT_GlyphLoader_Reset(FT_GlyphLoader loader)

{
  FT_Memory pFVar1;
  FT_Vector *pFVar2;
  char *pcVar3;
  short *psVar4;
  FT_SubGlyph pFVar5;
  short sVar6;
  undefined4 uVar7;
  long lVar8;
  FT_GlyphLoadRec *pFVar9;
  FT_GlyphLoadRec *pFVar10;
  byte bVar11;
  
  bVar11 = 0;
  pFVar1 = loader->memory;
  pFVar2 = (loader->base).outline.points;
  if (pFVar2 != (FT_Vector *)0x0) {
    (*pFVar1->free)(pFVar1,pFVar2);
  }
  (loader->base).outline.points = (FT_Vector *)0x0;
  pcVar3 = (loader->base).outline.tags;
  if (pcVar3 != (char *)0x0) {
    (*pFVar1->free)(pFVar1,pcVar3);
  }
  (loader->base).outline.tags = (char *)0x0;
  psVar4 = (loader->base).outline.contours;
  if (psVar4 != (short *)0x0) {
    (*pFVar1->free)(pFVar1,psVar4);
  }
  (loader->base).outline.contours = (short *)0x0;
  pFVar2 = (loader->base).extra_points;
  if (pFVar2 != (FT_Vector *)0x0) {
    (*pFVar1->free)(pFVar1,pFVar2);
  }
  (loader->base).extra_points = (FT_Vector *)0x0;
  pFVar5 = (loader->base).subglyphs;
  if (pFVar5 != (FT_SubGlyph)0x0) {
    (*pFVar1->free)(pFVar1,pFVar5);
  }
  (loader->base).subglyphs = (FT_SubGlyph)0x0;
  (loader->base).extra_points2 = (FT_Vector *)0x0;
  loader->max_points = 0;
  loader->max_contours = 0;
  loader->max_subglyphs = 0;
  (loader->base).outline.n_contours = 0;
  (loader->base).outline.n_points = 0;
  (loader->base).num_subglyphs = 0;
  pFVar9 = &loader->base;
  pFVar10 = &loader->current;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    sVar6 = (pFVar9->outline).n_points;
    uVar7 = *(undefined4 *)&(pFVar9->outline).field_0x4;
    (pFVar10->outline).n_contours = (pFVar9->outline).n_contours;
    (pFVar10->outline).n_points = sVar6;
    *(undefined4 *)&(pFVar10->outline).field_0x4 = uVar7;
    pFVar9 = (FT_GlyphLoadRec *)((long)pFVar9 + (ulong)bVar11 * -0x10 + 8);
    pFVar10 = (FT_GlyphLoadRec *)((long)pFVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_GlyphLoader_Reset( FT_GlyphLoader  loader )
  {
    FT_Memory memory = loader->memory;


    FT_FREE( loader->base.outline.points );
    FT_FREE( loader->base.outline.tags );
    FT_FREE( loader->base.outline.contours );
    FT_FREE( loader->base.extra_points );
    FT_FREE( loader->base.subglyphs );

    loader->base.extra_points2 = NULL;

    loader->max_points    = 0;
    loader->max_contours  = 0;
    loader->max_subglyphs = 0;

    FT_GlyphLoader_Rewind( loader );
  }